

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

void __thiscall google::protobuf::MapValueRef::SetInt32Value(MapValueRef *this,int32_t value)

{
  CppType CVar1;
  LogMessage *pLVar2;
  string_view sVar3;
  LogMessage LStack_28;
  
  CVar1 = MapValueConstRef::type(&this->super_MapValueConstRef);
  if (CVar1 == CPPTYPE_INT32) {
    *(int32_t *)(this->super_MapValueConstRef).data_ = value;
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.h"
             ,0x2e6);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&LStack_28,(char (*) [34])"Protocol Buffer map usage error:\n");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [27])"MapValueRef::SetInt32Value");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [22])" type does not match\n");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [14])"  Expected : ");
  sVar3 = FieldDescriptor::CppTypeName(CPPTYPE_INT32);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(char (*) [2])0x349f96);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [14])"  Actual   : ");
  CVar1 = MapValueConstRef::type(&this->super_MapValueConstRef);
  sVar3 = FieldDescriptor::CppTypeName(CVar1);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,sVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_28)
  ;
}

Assistant:

void SetInt32Value(int32_t value) {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_INT32, "MapValueRef::SetInt32Value");
    *reinterpret_cast<int32_t*>(data_) = value;
  }